

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall cmLocalUnixMakefileGenerator3::Generate(cmLocalUnixMakefileGenerator3 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmGlobalUnixMakefileGenerator3 *this_00;
  bool bVar3;
  TargetType TVar4;
  cmMakefileTargetGenerator *tg;
  _Alloc_hider _Var5;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string local_40;
  
  bVar3 = cmake::GetIsInTryCompile
                    (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                     CMakeInstance);
  if (!bVar3) {
    pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_COLOR_MAKEFILE","");
    bVar3 = cmMakefile::IsOn(pcVar2,&local_40);
    this->ColorMakefile = bVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CMAKE_SKIP_PREPROCESSED_SOURCE_RULES","");
  bVar3 = cmMakefile::IsOn(pcVar2,&local_40);
  this->SkipPreprocessedSourceRules = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CMAKE_SKIP_ASSEMBLY_SOURCE_RULES","");
  bVar3 = cmMakefile::IsOn(pcVar2,&local_40);
  this->SkipAssemblySourceRules = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_40,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets);
  if (local_40._M_dataplus._M_p != (pointer)local_40._M_string_length) {
    this_00 = (cmGlobalUnixMakefileGenerator3 *)
              (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    _Var5._M_p = local_40._M_dataplus._M_p;
    do {
      TVar4 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)_Var5._M_p);
      if (TVar4 != INTERFACE_LIBRARY) {
        tg = cmMakefileTargetGenerator::New(*(cmGeneratorTarget **)_Var5._M_p);
        if (tg != (cmMakefileTargetGenerator *)0x0) {
          (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])(tg);
          cmGlobalUnixMakefileGenerator3::RecordTargetProgress(this_00,tg);
          (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])(tg);
        }
      }
      _Var5._M_p = _Var5._M_p + 8;
    } while (_Var5._M_p != (pointer)local_40._M_string_length);
  }
  WriteLocalMakefile(this);
  WriteDirectoryInformationFile(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_40._M_dataplus._M_p,
                    local_40.field_2._M_allocated_capacity - (long)local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::Generate()
{
  // Record whether some options are enabled to avoid checking many
  // times later.
  if (!this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
    this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_MAKEFILE");
  }
  this->SkipPreprocessedSourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_PREPROCESSED_SOURCE_RULES");
  this->SkipAssemblySourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_ASSEMBLY_SOURCE_RULES");

  // Generate the rule files for each target.
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  for (std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
       t != targets.end(); ++t) {
    if ((*t)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    CM_AUTO_PTR<cmMakefileTargetGenerator> tg(
      cmMakefileTargetGenerator::New(*t));
    if (tg.get()) {
      tg->WriteRuleFiles();
      gg->RecordTargetProgress(tg.get());
    }
  }

  // write the local Makefile
  this->WriteLocalMakefile();

  // Write the cmake file with information for this directory.
  this->WriteDirectoryInformationFile();
}